

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

UniformWeighting * __thiscall
CoreML::Specification::UniformWeighting::New(UniformWeighting *this,Arena *arena)

{
  UniformWeighting *this_00;
  
  this_00 = (UniformWeighting *)operator_new(0x18);
  UniformWeighting(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::UniformWeighting>(arena,this_00);
  }
  return this_00;
}

Assistant:

UniformWeighting* UniformWeighting::New(::google::protobuf::Arena* arena) const {
  UniformWeighting* n = new UniformWeighting;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}